

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O0

Regexp * re2::Regexp::Star(Regexp *sub,ParseFlags flags)

{
  RegexpOp RVar1;
  ParseFlags PVar2;
  Regexp **ppRVar3;
  Regexp *re;
  ParseFlags flags_local;
  Regexp *sub_local;
  
  RVar1 = op(sub);
  if ((RVar1 != kRegexpStar) || (PVar2 = parse_flags(sub), sub_local = sub, PVar2 != flags)) {
    sub_local = (Regexp *)operator_new(0x28);
    Regexp(sub_local,kRegexpStar,flags);
    AllocSub(sub_local,1);
    ppRVar3 = Regexp::sub(sub_local);
    *ppRVar3 = sub;
  }
  return sub_local;
}

Assistant:

Regexp* Regexp::Star(Regexp* sub, ParseFlags flags) {
  if (sub->op() == kRegexpStar && sub->parse_flags() == flags)
    return sub;
  Regexp* re = new Regexp(kRegexpStar, flags);
  re->AllocSub(1);
  re->sub()[0] = sub;
  return re;
}